

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

qpdf_offset_t __thiscall QPDF::read_xrefStream(QPDF *this,qpdf_offset_t xref_offset)

{
  bool bVar1;
  QPDFExc *__return_storage_ptr__;
  qpdf_offset_t unaff_R15;
  allocator<char> local_8a;
  allocator<char> local_89;
  QPDFObjectHandle xref_obj;
  QPDFObjGen x_og;
  string local_68;
  string local_48;
  
  if (((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->ignore_xref_streams == false) {
    x_og.obj = 0;
    x_og.gen = 0;
    xref_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    xref_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"xref stream",&local_8a);
    readObjectAtOffset((QPDF *)&local_48,SUB81(this,0),0,(string *)xref_offset,(QPDFObjGen)&local_68
                       ,(QPDFObjGen *)0x0,SUB81(&x_og,0));
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&xref_obj,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"/XRef",&local_8a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_89);
    bVar1 = QPDFObjectHandle::isStreamOfType(&xref_obj,&local_68,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar1) {
      unaff_R15 = processXRefStream(this,xref_offset,&xref_obj);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&xref_obj.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (bVar1) {
      return unaff_R15;
    }
  }
  __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"",(allocator<char> *)&xref_obj);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"xref not found",(allocator<char> *)&x_og);
  damagedPDF(__return_storage_ptr__,this,&local_68,xref_offset,&local_48);
  __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

qpdf_offset_t
QPDF::read_xrefStream(qpdf_offset_t xref_offset)
{
    if (!m->ignore_xref_streams) {
        QPDFObjGen x_og;
        QPDFObjectHandle xref_obj;
        try {
            xref_obj =
                readObjectAtOffset(false, xref_offset, "xref stream", QPDFObjGen(0, 0), x_og, true);
        } catch (QPDFExc&) {
            // ignore -- report error below
        }
        if (xref_obj.isStreamOfType("/XRef")) {
            QTC::TC("qpdf", "QPDF found xref stream");
            return processXRefStream(xref_offset, xref_obj);
        }
    }

    QTC::TC("qpdf", "QPDF can't find xref");
    throw damagedPDF("", xref_offset, "xref not found");
    return 0; // unreachable
}